

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock.cc
# Opt level: O2

void fdb_rollback_stale_blocks(fdb_kvs_handle *handle,filemgr_header_revnum_t cur_revnum)

{
  avl_node *node;
  avl_node *paVar1;
  avl_node *paVar2;
  uint64_t uVar3;
  avl_node *e;
  filemgr_header_revnum_t _revnum;
  stale_info_commit query;
  ulong local_68;
  avl_node local_60;
  uint64_t local_48;
  
  uVar3 = handle->rollback_revnum;
  if (uVar3 != 0) {
    for (; uVar3 < cur_revnum; uVar3 = uVar3 + 1) {
      local_68 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                 (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                 (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
                 uVar3 << 0x38;
      btree_remove(handle->staletree,&local_68);
      btreeblk_end(handle->bhandle);
    }
    local_48 = handle->rollback_revnum;
    node = avl_search(&handle->file->stale_info_tree,&local_60,_inmem_stale_cmp);
    if (node == (avl_node *)0x0) {
      node = avl_search_greater(&handle->file->stale_info_tree,&local_60,_inmem_stale_cmp);
    }
    while (node != (avl_node *)0x0) {
      paVar1 = avl_next(node);
      avl_remove(&handle->file->stale_info_tree,node);
      e = node[1].left;
      while (e != (avl_node *)0x0) {
        paVar2 = (avl_node *)list_remove((list *)&node[1].left,(list_elem *)e);
        free(e->right);
        free(e);
        e = paVar2;
      }
      free(node);
      node = paVar1;
    }
  }
  return;
}

Assistant:

void fdb_rollback_stale_blocks(fdb_kvs_handle *handle,
                               filemgr_header_revnum_t cur_revnum)
{
    btree_result br;
    filemgr_header_revnum_t i, _revnum;
    struct avl_node *avl;
    struct list_elem *elem;
    struct stale_info_commit *commit, query;
    struct stale_info_entry *entry;

    if (handle->rollback_revnum == 0) {
        return;
    }

    // remove from on-disk stale-tree
    for (i = handle->rollback_revnum; i < cur_revnum; ++i) {
        _revnum = _endian_encode(i);
        br = btree_remove(handle->staletree, (void*)&_revnum);
        // don't care the result
        (void)br;
        btreeblk_end(handle->bhandle);
    }

    // also remove from in-memory stale-tree
    query.revnum = handle->rollback_revnum;
    avl = avl_search(&handle->file->stale_info_tree,
                   &query.avl, _inmem_stale_cmp);
    if (!avl) {
        avl = avl_search_greater(&handle->file->stale_info_tree,
                               &query.avl, _inmem_stale_cmp);
    }
    while (avl) {
        commit = _get_entry(avl, struct stale_info_commit, avl);
        avl = avl_next(avl);

        avl_remove(&handle->file->stale_info_tree, &commit->avl);

        elem = list_begin(&commit->doc_list);
        while (elem) {
            entry = _get_entry(elem, struct stale_info_entry, le);
            elem = list_remove(&commit->doc_list, &entry->le);

            free(entry->ctx);
            free(entry);
        }

        free(commit);
    }
}